

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryWriter::writeStart(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *pBVar1;
  int32_t start;
  uint32_t uVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  void *__buf;
  string_view sVar3;
  undefined8 uStack_28;
  
  uStack_28 = this->wasm;
  if ((uStack_28->start).super_IString.str._M_str != (char *)0x0) {
    start = startSection<wasm::BinaryConsts::Section>(this,Start);
    pBVar1 = this->o;
    sVar3._M_str = (char *)0x0;
    sVar3._M_len = (size_t)(this->wasm->start).super_IString.str._M_str;
    sVar3 = IString::interned((IString *)(this->wasm->start).super_IString.str._M_len,sVar3,
                              (bool)in_CL);
    uVar2 = getFunctionIndex(this,(Name)sVar3);
    uStack_28 = (Module *)CONCAT44(uVar2,(undefined4)uStack_28);
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)((long)&uStack_28 + 4),(int)pBVar1,__buf,
               CONCAT71(in_register_00000009,in_CL));
    finishSection(this,start);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeStart() {
  if (!wasm->start.is()) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Start);
  o << U32LEB(getFunctionIndex(wasm->start.str));
  finishSection(start);
}